

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O2

bool QXmlUtils::isChar(char32_t c)

{
  if ((0xd7df < (uint)(c + L'\xffffffe0')) &&
     (((0xd < (uint)c || ((0x2600U >> (c & 0x1fU) & 1) == 0)) &&
      (0x1ffd < (uint)(c + L'\xffff2000'))))) {
    return (uint)(c + L'\xffff0000') < 0x100000;
  }
  return true;
}

Assistant:

bool QXmlUtils::isChar(const char32_t c)
{
    // The valid range is defined by https://www.w3.org/TR/REC-xml/#NT-Char as following:
    // Char ::= #x9 | #xA | #xD | [#x20-#xD7FF] | [#xE000-#xFFFD] | [#x10000-#x10FFFF]
    return (c >= 0x0020 && c <= 0xD7FF)
           || c == 0x0009
           || c == 0x000A
           || c == 0x000D
           || (c >= 0xE000 && c <= 0xFFFD)
           || (c >= 0x10000 && c <= 0x10FFFF);
}